

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O0

Result * CoreML::Result::featureTypeInvariantError
                   (Result *__return_storage_ptr__,
                   vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *allowed,
                   FeatureType *actual)

{
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  _Var1;
  ostream *poVar2;
  uchar auVar3 [8];
  const_reference this;
  size_type sVar4;
  string local_228 [32];
  string local_208;
  size_t i;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [383];
  byte local_21;
  FeatureType *local_20;
  FeatureType *actual_local;
  vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *allowed_local;
  Result *out;
  
  local_21 = 0;
  local_20 = actual;
  actual_local = (FeatureType *)allowed;
  allowed_local =
       (vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *)__return_storage_ptr__;
  Result(__return_storage_ptr__);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(local_1a0,"Feature type invariant violation. Expected feature type ");
  FeatureType::toString_abi_cxx11_((string *)&i,local_20);
  poVar2 = std::operator<<(local_1a0,(string *)&i);
  std::operator<<(poVar2," to be one of: ");
  std::__cxx11::string::~string((string *)&i);
  local_208._M_storage._M_storage[0] = '\0';
  local_208._M_storage._M_storage[1] = '\0';
  local_208._M_storage._M_storage[2] = '\0';
  local_208._M_storage._M_storage[3] = '\0';
  local_208._M_storage._M_storage[4] = '\0';
  local_208._M_storage._M_storage[5] = '\0';
  local_208._M_storage._M_storage[6] = '\0';
  local_208._M_storage._M_storage[7] = '\0';
  while( true ) {
    _Var1._M_storage = local_208._M_storage._M_storage;
    auVar3 = (uchar  [8])
             std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>::size
                       ((vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *)
                        actual_local);
    if ((ulong)auVar3 <= (ulong)_Var1._M_storage) break;
    this = std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>::operator[]
                     ((vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *)
                      actual_local,(size_type)local_208._M_storage._M_storage);
    FeatureType::toString_abi_cxx11_(&local_208,this);
    std::operator<<(local_1a0,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    _Var1._M_storage = local_208._M_storage._M_storage;
    sVar4 = std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>::size
                      ((vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *)
                       actual_local);
    if (_Var1._M_storage != (uchar  [8])(sVar4 - 1)) {
      std::operator<<(local_1a0,", ");
    }
    local_208._M_storage._M_storage = local_208._M_storage._M_storage + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_message,local_228);
  std::__cxx11::string::~string(local_228);
  __return_storage_ptr__->m_type = FEATURE_TYPE_INVARIANT_VIOLATION;
  local_21 = 1;
  std::__cxx11::stringstream::~stringstream(local_1b0);
  if ((local_21 & 1) == 0) {
    ~Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result Result::featureTypeInvariantError(
      const std::vector<FeatureType>& allowed,
      const FeatureType& actual) {

    Result out;
    std::stringstream ss;
    ss << "Feature type invariant violation. Expected feature type ";
    ss << actual.toString() << " to be one of: ";
    for (size_t i=0; i<allowed.size(); i++) {
      ss << allowed[i].toString();
      if (i != allowed.size() - 1) {
        ss << ", ";
      }
    }
    out.m_message = ss.str();
    out.m_type = ResultType::FEATURE_TYPE_INVARIANT_VIOLATION;
    return out;
  }